

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::StrengthReductionPass::ScanFunctions(StrengthReductionPass *this)

{
  bool bVar1;
  Op OVar2;
  Module *this_00;
  reference this_01;
  Instruction *this_02;
  undefined1 local_88 [16];
  iterator inst;
  value_type *bb;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  value_type *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  bool modified;
  StrengthReductionPass *this_local;
  
  __range2._7_1_ = false;
  this_00 = Pass::get_module(&this->super_Pass);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _func = Module::end(this_00);
  while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    join_0x00000010_0x00000000_ = opt::Function::begin(this_01);
    _bb = opt::Function::end(this_01);
    while (bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end3.iterator_,
                              (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&bb), bVar1) {
      inst.super_iterator.node_ =
           (iterator)
           UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
      BasicBlock::begin((BasicBlock *)(local_88 + 8));
      while( true ) {
        BasicBlock::end((BasicBlock *)local_88);
        bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_88 + 8),
                                  (iterator_template<spvtools::opt::Instruction> *)local_88);
        if (!bVar1) break;
        this_02 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator->
                            ((iterator_template<spvtools::opt::Instruction> *)(local_88 + 8));
        OVar2 = opt::Instruction::opcode(this_02);
        if ((OVar2 == OpIMul) &&
           (bVar1 = ReplaceMultiplyByPowerOf2(this,(iterator *)(local_88 + 8)), bVar1)) {
          __range2._7_1_ = true;
        }
        InstructionList::iterator::operator++((iterator *)(local_88 + 8));
      }
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  return __range2._7_1_;
}

Assistant:

bool StrengthReductionPass::ScanFunctions() {
  // I did not use |ForEachInst| in the module because the function that acts on
  // the instruction gets a pointer to the instruction.  We cannot use that to
  // insert a new instruction.  I want an iterator.
  bool modified = false;
  for (auto& func : *get_module()) {
    for (auto& bb : func) {
      for (auto inst = bb.begin(); inst != bb.end(); ++inst) {
        switch (inst->opcode()) {
          case spv::Op::OpIMul:
            if (ReplaceMultiplyByPowerOf2(&inst)) modified = true;
            break;
          default:
            break;
        }
      }
    }
  }
  return modified;
}